

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

void parse_output_preds(options_i *options,vw *all)

{
  _Alloc_hider _Var1;
  bool bVar2;
  int iVar3;
  option_group_definition *this;
  ostream *poVar4;
  allocator local_2be;
  allocator local_2bd;
  allocator local_2bc;
  allocator local_2bb;
  allocator local_2ba;
  allocator local_2b9;
  string raw_predictions;
  string predictions;
  undefined1 local_278 [80];
  string local_228 [80];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198;
  string local_178 [32];
  string local_158 [32];
  string local_138;
  string local_118;
  option_group_definition output_options;
  undefined1 local_c0 [80];
  string local_70 [80];
  
  predictions._M_dataplus._M_p = (pointer)&predictions.field_2;
  predictions._M_string_length = 0;
  predictions.field_2._M_local_buf[0] = '\0';
  raw_predictions._M_dataplus._M_p = (pointer)&raw_predictions.field_2;
  raw_predictions._M_string_length = 0;
  raw_predictions.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_118,"Output options",(allocator *)local_278);
  VW::config::option_group_definition::option_group_definition(&output_options,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string((string *)&local_138,"predictions",&local_2b9);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_278,&local_138,&predictions);
  std::__cxx11::string::string(local_158,"p",&local_2ba);
  std::__cxx11::string::_M_assign(local_228);
  std::__cxx11::string::string(local_178,"File to output predictions to",&local_2bb);
  std::__cxx11::string::_M_assign((string *)(local_278 + 0x30));
  this = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                   (&output_options,
                    (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_278);
  std::__cxx11::string::string((string *)&local_198,"raw_predictions",&local_2bc);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_c0,&local_198,&raw_predictions);
  std::__cxx11::string::string(local_1b8,"r",&local_2bd);
  std::__cxx11::string::_M_assign(local_70);
  std::__cxx11::string::string(local_1d8,"File to output unnormalized predictions to",&local_2be);
  std::__cxx11::string::_M_assign((string *)(local_c0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (this,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_c0);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::string::~string(local_1b8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_c0);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::~string(local_158);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_278);
  std::__cxx11::string::~string((string *)&local_138);
  (**options->_vptr_options_i)(options,&output_options);
  std::__cxx11::string::string((string *)local_278,"predictions",(allocator *)local_c0);
  iVar3 = (*options->_vptr_options_i[1])(options,local_278);
  std::__cxx11::string::~string((string *)local_278);
  if ((char)iVar3 != '\0') {
    if (all->quiet == false) {
      poVar4 = std::operator<<(&(all->trace_message).super_ostream,"predictions = ");
      poVar4 = std::operator<<(poVar4,(string *)&predictions);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    bVar2 = std::operator==(&predictions,"stdout");
    _Var1 = predictions._M_dataplus;
    if (bVar2) {
      local_278._0_4_ = 1;
      v_array<int>::push_back(&all->final_prediction_sink,(int *)local_278);
    }
    else {
      local_278._0_4_ = open64(predictions._M_dataplus._M_p,0x241,0x1b6);
      if ((int)local_278._0_4_ < 0) {
        poVar4 = std::operator<<(&(all->trace_message).super_ostream,
                                 "Error opening the predictions file: ");
        poVar4 = std::operator<<(poVar4,_Var1._M_p);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      v_array<int>::push_back(&all->final_prediction_sink,(int *)local_278);
    }
  }
  std::__cxx11::string::string((string *)local_278,"raw_predictions",(allocator *)local_c0);
  iVar3 = (*options->_vptr_options_i[1])(options,local_278);
  std::__cxx11::string::~string((string *)local_278);
  if ((char)iVar3 != '\0') {
    if (all->quiet == false) {
      poVar4 = std::operator<<(&(all->trace_message).super_ostream,"raw predictions = ");
      poVar4 = std::operator<<(poVar4,(string *)&raw_predictions);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::string((string *)local_278,"binary",(allocator *)local_c0);
      iVar3 = (*options->_vptr_options_i[1])(options,local_278);
      std::__cxx11::string::~string((string *)local_278);
      if ((char)iVar3 != '\0') {
        poVar4 = std::operator<<(&(all->trace_message).super_ostream,
                                 "Warning: --raw_predictions has no defined value when --binary specified, expect no output"
                                );
        std::endl<char,std::char_traits<char>>(poVar4);
      }
    }
    bVar2 = std::operator==(&raw_predictions,"stdout");
    if (bVar2) {
      iVar3 = 1;
    }
    else {
      iVar3 = open64(raw_predictions._M_dataplus._M_p,0x241,0x1b6);
    }
    all->raw_prediction = iVar3;
  }
  VW::config::option_group_definition::~option_group_definition(&output_options);
  std::__cxx11::string::~string((string *)&raw_predictions);
  std::__cxx11::string::~string((string *)&predictions);
  return;
}

Assistant:

void parse_output_preds(options_i& options, vw& all)
{
  std::string predictions;
  std::string raw_predictions;

  option_group_definition output_options("Output options");
  output_options.add(make_option("predictions", predictions).short_name("p").help("File to output predictions to"))
      .add(make_option("raw_predictions", raw_predictions)
               .short_name("r")
               .help("File to output unnormalized predictions to"));
  options.add_and_parse(output_options);

  if (options.was_supplied("predictions"))
  {
    if (!all.quiet)
      all.trace_message << "predictions = " << predictions << endl;

    if (predictions == "stdout")
    {
      all.final_prediction_sink.push_back((size_t)1);  // stdout
    }
    else
    {
      const char* fstr = predictions.c_str();
      int f;
      // TODO can we migrate files to fstreams?
#ifdef _WIN32
      _sopen_s(&f, fstr, _O_CREAT | _O_WRONLY | _O_BINARY | _O_TRUNC, _SH_DENYWR, _S_IREAD | _S_IWRITE);
#else
      f = open(fstr, O_CREAT | O_WRONLY | O_LARGEFILE | O_TRUNC, 0666);
#endif
      if (f < 0)
        all.trace_message << "Error opening the predictions file: " << fstr << endl;
      all.final_prediction_sink.push_back((size_t)f);
    }
  }

  if (options.was_supplied("raw_predictions"))
  {
    if (!all.quiet)
    {
      all.trace_message << "raw predictions = " << raw_predictions << endl;
      if (options.was_supplied("binary"))
        all.trace_message << "Warning: --raw_predictions has no defined value when --binary specified, expect no output"
                          << endl;
    }
    if (raw_predictions == "stdout")
      all.raw_prediction = 1;  // stdout
    else
    {
      const char* t = raw_predictions.c_str();
      int f;
#ifdef _WIN32
      _sopen_s(&f, t, _O_CREAT | _O_WRONLY | _O_BINARY | _O_TRUNC, _SH_DENYWR, _S_IREAD | _S_IWRITE);
#else
      f = open(t, O_CREAT | O_WRONLY | O_LARGEFILE | O_TRUNC, 0666);
#endif
      all.raw_prediction = f;
    }
  }
}